

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void number_suite::value_int64(void)

{
  size_type sVar1;
  UI_STRING *uis;
  char *ui;
  undefined4 local_2c4;
  value local_2c0;
  undefined1 local_2bb;
  undefined1 local_2ba [2];
  undefined8 local_2b8;
  type_conflict4 local_2b0;
  undefined4 local_2a4;
  type_conflict3 local_2a0 [2];
  undefined8 local_298;
  type_conflict local_290 [7];
  error *ex_8;
  error *ex_7;
  error *ex_6;
  error *ex_5;
  error *ex_4;
  type local_190 [7];
  error *ex_3;
  error *ex_2;
  error *ex_1;
  error *ex;
  value local_c0 [2];
  undefined4 local_b8;
  value local_b4 [6];
  undefined4 local_9c;
  value local_98 [2];
  undefined1 local_90 [8];
  reader reader;
  value_type input [9];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x100000000d6;
  trial::protocol::bintoken::reader::reader<unsigned_char[9]>
            ((reader *)local_90,
             (uchar (*) [9])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  local_98[0] = trial::protocol::bintoken::reader::code((reader *)local_90);
  local_9c = 0xd6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23b,"void number_suite::value_int64()",local_98,&local_9c);
  local_b4[0] = trial::protocol::bintoken::reader::symbol((reader *)local_90);
  local_b8 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23c,"void number_suite::value_int64()",local_b4,&local_b8);
  local_c0[0] = trial::protocol::bintoken::reader::category((reader *)local_90);
  ex._4_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23d,"void number_suite::value_int64()",local_c0,(long)&ex + 4);
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_90);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x23e,"void number_suite::value_int64()",sVar1 == 1);
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::boolean>
            ((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::boolean>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x241,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int8>
            ((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x243,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int16>
            ((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int16>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x245,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int32>
            ((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x247,"void number_suite::value_int64()");
  local_190[0] = trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int64>
                           ((reader *)local_90);
  ex_4 = (error *)0x100000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64>()","UINT64_C(0x100000000)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x248,"void number_suite::value_int64()",local_190,&ex_4);
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float32>
            ((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x24a,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float64>
            ((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x24c,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::value<signed_char>((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::int8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x24f,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::value<short>((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::int16_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x251,"void number_suite::value_int64()");
  trial::protocol::bintoken::reader::value<int>((reader *)local_90);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::int32_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x253,"void number_suite::value_int64()");
  local_290[0] = trial::protocol::bintoken::reader::value<long>((reader *)local_90);
  local_298 = 0x100000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64::type>()","UINT64_C(0x100000000)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x254,"void number_suite::value_int64()",local_290,&local_298);
  local_2a0[0] = trial::protocol::bintoken::reader::value<float>((reader *)local_90);
  local_2a4 = 0x4f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("reader.value<token::float32::type>()","4294967296.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x255,"void number_suite::value_int64()",local_2a0,&local_2a4);
  local_2b0 = trial::protocol::bintoken::reader::value<double>((reader *)local_90);
  local_2b8 = 0x41f0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<token::float64::type>()","4294967296.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x256,"void number_suite::value_int64()",&local_2b0,&local_2b8);
  local_2ba[0] = trial::protocol::bintoken::reader::next((reader *)local_90);
  local_2bb = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,599,"void number_suite::value_int64()",local_2ba,&local_2bb);
  local_2c0 = trial::protocol::bintoken::reader::code((reader *)local_90);
  local_2c4 = 0;
  ui = "token::code::end";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,600,"void number_suite::value_int64()",&local_2c0,&local_2c4);
  trial::protocol::bintoken::reader::~reader((reader *)local_90,(UI *)ui,uis);
  return;
}

Assistant:

void value_int64()
{
    const value_type input[] = { token::code::int64, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int64);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::boolean>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int16>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64>(), UINT64_C(0x100000000));
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int16_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int32_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64::type>(), UINT64_C(0x100000000));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float32::type>(), 4294967296.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float64::type>(), 4294967296.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}